

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

Block * __thiscall
moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
requisition_block<(moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
          (ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits> *this)

{
  ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits> *pCVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict2 _Var3;
  ulong uVar4;
  uint uVar5;
  Block *pBVar6;
  Block *pBVar7;
  __pointer_type pBVar8;
  __pointer_type pBVar9;
  Block *pBVar10;
  bool bVar11;
  bool bVar12;
  
  if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
    LOCK();
    pCVar1 = this + 0x10;
    uVar4 = *(ulong *)pCVar1;
    *(ulong *)pCVar1 = *(ulong *)pCVar1 + 1;
    UNLOCK();
    pBVar10 = (Block *)0x0;
    if (uVar4 < *(ulong *)(this + 0x20)) {
      pBVar10 = (Block *)(uVar4 * 0xd0 + *(long *)(this + 0x18));
    }
  }
  else {
    pBVar10 = (Block *)0x0;
  }
  if (pBVar10 == (Block *)0x0) {
    pBVar6 = *(Block **)(this + 0x28);
    do {
      if (pBVar6 == (Block *)0x0) {
        pBVar10 = (Block *)0x0;
        break;
      }
      uVar5 = (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i;
      if ((uVar5 & 0x7fffffff) == 0) {
LAB_0014e184:
        pBVar7 = *(Block **)(this + 0x28);
        bVar11 = false;
      }
      else {
        LOCK();
        bVar11 = uVar5 == (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i;
        if (bVar11) {
          (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i = uVar5 + 1;
        }
        UNLOCK();
        if (!bVar11) goto LAB_0014e184;
        LOCK();
        pBVar7 = *(Block **)(this + 0x28);
        bVar11 = pBVar6 == pBVar7;
        if (bVar11) {
          *(__pointer_type *)(this + 0x28) = (pBVar6->freeListNext)._M_b._M_p;
          pBVar7 = pBVar6;
        }
        UNLOCK();
        if (bVar11) {
          if ((int)(pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i < 0) {
            __assert_fail("(head->freeListRefs.load(std::memory_order_relaxed) & SHOULD_BE_ON_FREELIST) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                          ,0x574,
                          "N *moodycamel::ConcurrentQueue<unsigned int>::FreeList<moodycamel::ConcurrentQueue<unsigned int>::Block>::try_get() [T = unsigned int, Traits = moodycamel::ConcurrentQueueDefaultTraits, N = moodycamel::ConcurrentQueue<unsigned int>::Block]"
                         );
          }
          LOCK();
          (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i =
               (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i - 2;
          UNLOCK();
          bVar11 = true;
          pBVar10 = pBVar6;
          pBVar7 = pBVar6;
        }
        else {
          LOCK();
          paVar2 = &pBVar6->freeListRefs;
          _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          bVar11 = false;
          if (_Var3 == 0x80000001) {
            pBVar8 = *(__pointer_type *)(this + 0x28);
            do {
              (pBVar6->freeListNext)._M_b._M_p = pBVar8;
              (pBVar6->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
              LOCK();
              pBVar9 = *(__pointer_type *)(this + 0x28);
              bVar12 = pBVar8 == pBVar9;
              if (bVar12) {
                *(Block **)(this + 0x28) = pBVar6;
                pBVar9 = pBVar8;
              }
              UNLOCK();
              if (bVar12) break;
              LOCK();
              paVar2 = &pBVar6->freeListRefs;
              _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
              (paVar2->super___atomic_base<unsigned_int>)._M_i =
                   (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
              UNLOCK();
              pBVar8 = pBVar9;
            } while (_Var3 == 1);
          }
        }
      }
      pBVar6 = pBVar7;
    } while (!bVar11);
    if (pBVar10 == (Block *)0x0) {
      pBVar10 = (Block *)malloc(0xd0);
      if (pBVar10 == (Block *)0x0) {
        pBVar10 = (Block *)0x0;
      }
      else {
        (pBVar10->freeListRefs).super___atomic_base<unsigned_int>._M_i = 0;
        (pBVar10->freeListNext)._M_b._M_p = (__pointer_type)0x0;
        pBVar10->shouldBeOnFreeList = (__atomic_base<bool>)0x0;
        pBVar10->dynamicallyAllocated = true;
        pBVar10->next = (Block *)0x0;
        (pBVar10->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
      }
    }
  }
  return pBVar10;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}
		
		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}
		
		if (canAlloc == CanAlloc) {
			return create<Block>();
		}
		
		return nullptr;
	}